

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswread.c
# Opt level: O2

int ssw_loadrecord(ssw_fileinternal_t *f)

{
  mcpl_generic_filehandle_t *pmVar1;
  int iVar2;
  char *pcVar3;
  size_t __size;
  FILE *__s;
  ulong uVar4;
  bool bVar5;
  uint32_t rl;
  undefined4 uStack_1c;
  
  if (f->reclen == 4) {
    iVar2 = ssw_try_readbytes(f,(char *)&rl,4);
    if (iVar2 == 0) {
      return 0;
    }
    __size = (size_t)rl;
  }
  else {
    iVar2 = ssw_try_readbytes(f,(char *)&rl,8);
    if (iVar2 == 0) {
      return 0;
    }
    __size = CONCAT44(uStack_1c,rl);
  }
  f->lbuf = __size;
  uVar4 = f->lbufmax;
  if (f->lbufmax < __size) {
    if (0x3fffffff < __size) {
      ssw_error("too large record encountered");
    }
    free(f->buf);
    __size = f->lbuf;
    f->lbufmax = __size;
    pcVar3 = (char *)malloc(__size);
    f->buf = pcVar3;
    uVar4 = __size;
    if (pcVar3 == (char *)0x0) goto LAB_00102618;
  }
  if (0x400 < uVar4 && __size < 0x401) {
    free(f->buf);
    f->lbufmax = 0x400;
    pcVar3 = (char *)malloc(0x400);
    f->buf = pcVar3;
    if (pcVar3 == (char *)0x0) {
LAB_00102618:
      ssw_error("memory allocation failure");
    }
  }
  if (f->buf == (char *)0x0) {
    __s = (FILE *)ssw_impl_stdout_data::thefh;
    if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
      __s = _stdout;
    }
    fwrite("SSW Error: unable to allocate requested buffer (corrupted input?).\n",0x43,1,__s);
    return 0;
  }
  pmVar1 = &f->filehandle;
  mcpl_generic_fread(pmVar1,f->buf,f->lbuf);
  if (f->reclen == 4) {
    mcpl_generic_fread(pmVar1,&rl,4);
    bVar5 = f->lbuf == (ulong)rl;
  }
  else {
    mcpl_generic_fread(pmVar1,&rl,8);
    bVar5 = f->lbuf == CONCAT44(uStack_1c,rl);
  }
  return (uint)bVar5;
}

Assistant:

int ssw_loadrecord(ssw_fileinternal_t* f)
{
  if (f->reclen==4) {
    uint32_t rl;
    if (!ssw_try_readbytes(f, (char*)&rl, 4))
      return 0;
    f->lbuf = rl;
  } else {
    uint64_t rl;
    if (!ssw_try_readbytes(f, (char*)&rl, 8))
      return 0;
    f->lbuf = rl;
  }

  if (f->lbuf > f->lbufmax) {
    //Very large record, must grow buffer. But first check it fits in 32 integer
    //limit (so we can cast below):
    if (f->lbuf > INT_MAX / 2 )
      ssw_error("too large record encountered");
    free(f->buf);
    f->lbufmax = f->lbuf;
    f->buf = malloc(f->lbufmax);
    if (!f->buf)
      ssw_error("memory allocation failure");
  }

  if ( f->lbuf <= SSWREAD_STDBUFSIZE
       && f->lbufmax > SSWREAD_STDBUFSIZE ) {
    //Make sure we don't hold on to very large buffers once they are no longer
    //needed:
    free(f->buf);
    f->lbufmax = SSWREAD_STDBUFSIZE;
    f->buf = malloc(f->lbufmax);
    if (!f->buf)
      ssw_error("memory allocation failure");
  }

  if (!f->buf) {
    //Could be corrupted data resulting in unusually large lbuf:
    fprintf(ssw_stdout(),
            "SSW Error: unable to allocate"
            " requested buffer (corrupted input?).\n");
    return 0;
  }

  char * buf = (char*)f->buf;
  ssw_readbytes(f, buf, f->lbuf );
  if (f->reclen==4) {
    uint32_t rl;
    ssw_readbytes(f, (char*)&rl, 4);
    return ( f->lbuf == rl );
  } else {
    uint64_t rl;
    ssw_readbytes(f, (char*)&rl, 8);
    return ( f->lbuf == rl );
  }
}